

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetActionCost
          (EnvironmentNAVXYTHETALATTICE *this,int SourceX,int SourceY,int SourceTheta,
          EnvNAVXYTHETALATAction_t *action)

{
  pointer psVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  pointer psVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int *piVar15;
  byte bVar16;
  byte bVar17;
  uchar **local_58;
  
  iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])();
  iVar11 = 1000000000;
  if (((char)iVar3 != '\0') &&
     (iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                        (this,(ulong)(uint)(action->dX + SourceX),
                         (ulong)(uint)(action->dY + SourceY)), (char)iVar3 != '\0')) {
    local_58 = (this->EnvNAVXYTHETALATCfg).Grid2D;
    lVar6 = (long)SourceX;
    lVar13 = action->dX + lVar6;
    lVar9 = (long)SourceY;
    lVar14 = action->dY + lVar9;
    bVar2 = (this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh;
    if (local_58[lVar13][lVar14] < bVar2) {
      psVar1 = (action->interm3DcellsV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(action->interm3DcellsV).
                      super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 2) *
               -0x5555555555555555;
      if ((int)(uint)uVar10 < 1) {
        bVar17 = 0;
      }
      else {
        piVar15 = &psVar1->y;
        uVar7 = 0;
        bVar16 = 0;
        do {
          if (uVar10 - uVar7 == 0) goto LAB_00128010;
          uVar12 = ((sbpl_xy_theta_cell_t *)(piVar15 + -1))->x + SourceX;
          if ((int)uVar12 < 0) {
            return 1000000000;
          }
          if ((this->EnvNAVXYTHETALATCfg).EnvWidth_c <= (int)uVar12) {
            return 1000000000;
          }
          uVar4 = *piVar15 + SourceY;
          if ((int)uVar4 < 0) {
            return 1000000000;
          }
          if ((this->EnvNAVXYTHETALATCfg).EnvHeight_c <= (int)uVar4) {
            return 1000000000;
          }
          bVar17 = local_58[uVar12][uVar4];
          if (bVar2 <= bVar17) {
            return 1000000000;
          }
          if (bVar17 < bVar16) {
            bVar17 = bVar16;
          }
          uVar7 = uVar7 + 1;
          piVar15 = piVar15 + 3;
          bVar16 = bVar17;
        } while (((uint)uVar10 & 0x7fffffff) != uVar7);
      }
      if ((0x10 < (ulong)((long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                                super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->EnvNAVXYTHETALATCfg).FootprintPolygon.
                               super__Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>._M_impl
                               .super__Vector_impl_data._M_start)) &&
         ((this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh <= (int)(uint)bVar17)) {
        checks = checks + 1;
        psVar8 = (action->intersectingcellsV).
                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (long)(action->intersectingcellsV).
                      super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)psVar8 >> 3;
        if (0 < (int)uVar7) {
          uVar10 = 0;
          do {
            if (uVar7 <= uVar10) {
LAB_00128010:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
            }
            iVar3 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x41])
                              (this,(ulong)(uint)(psVar8[uVar10].x + SourceX),
                               (ulong)(uint)(psVar8[uVar10].y + SourceY));
            if ((char)iVar3 == '\0') {
              return 1000000000;
            }
            uVar10 = uVar10 + 1;
            psVar8 = (action->intersectingcellsV).
                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar5 = (long)(action->intersectingcellsV).
                          super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)psVar8;
            uVar7 = (long)uVar5 >> 3;
          } while ((long)uVar10 < (long)(int)(uVar5 >> 3));
          local_58 = (this->EnvNAVXYTHETALATCfg).Grid2D;
          lVar13 = action->dX + lVar6;
          lVar14 = action->dY + lVar9;
        }
      }
      bVar2 = local_58[lVar6][lVar9];
      if (local_58[lVar6][lVar9] < bVar17) {
        bVar2 = bVar17;
      }
      if (bVar2 <= local_58[lVar13][lVar14]) {
        bVar2 = local_58[lVar13][lVar14];
      }
      iVar11 = (bVar2 + 1) * action->cost;
    }
  }
  return iVar11;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetActionCost(
    int SourceX, int SourceY, int SourceTheta,
    EnvNAVXYTHETALATAction_t* action)
{
    sbpl_2Dcell_t cell;
    sbpl_xy_theta_cell_t interm3Dcell;
    int i;

    // TODO - go over bounding box (minpt and maxpt) to test validity and skip
    // testing boundaries below, also order intersect cells so that the four
    // farthest pts go first

    if (!IsValidCell(SourceX, SourceY)) {
        return INFINITECOST;
    }
    if (!IsValidCell(SourceX + action->dX, SourceY + action->dY)) {
        return INFINITECOST;
    }

    if (EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY] >=
        EnvNAVXYTHETALATCfg.cost_inscribed_thresh)
    {
        return INFINITECOST;
    }

    // need to iterate over discretized center cells and compute cost based on them
    unsigned char maxcellcost = 0;
    for (i = 0; i < (int)action->interm3DcellsV.size(); i++) {
        interm3Dcell = action->interm3DcellsV.at(i);
        interm3Dcell.x = interm3Dcell.x + SourceX;
        interm3Dcell.y = interm3Dcell.y + SourceY;

        if (interm3Dcell.x < 0 || interm3Dcell.x >= EnvNAVXYTHETALATCfg.EnvWidth_c ||
            interm3Dcell.y < 0 || interm3Dcell.y >= EnvNAVXYTHETALATCfg.EnvHeight_c)
        {
            return INFINITECOST;
        }

        maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[interm3Dcell.x][interm3Dcell.y]);

        // check that the robot is NOT in the cell at which there is no valid orientation
        if (maxcellcost >= EnvNAVXYTHETALATCfg.cost_inscribed_thresh) {
            return INFINITECOST;
        }
    }

    // check collisions that for the particular footprint orientation along the action
    if (EnvNAVXYTHETALATCfg.FootprintPolygon.size() > 1 &&
        (int)maxcellcost >= EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh)
    {
        checks++;

        for (i = 0; i < (int)action->intersectingcellsV.size(); i++) {
            // get the cell in the map
            cell = action->intersectingcellsV.at(i);
            cell.x = cell.x + SourceX;
            cell.y = cell.y + SourceY;

            // check validity
            if (!IsValidCell(cell.x, cell.y)) {
                return INFINITECOST;
            }

// cost computation changed: cost = max(cost of centers of the robot along
// action) intersecting cells are only used for collision checking
//            if (EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y] > currentmaxcost) {
//              currentmaxcost = EnvNAVXYTHETALATCfg.Grid2D[cell.x][cell.y];
//            }
        }
    }

    // to ensure consistency of h2D:
    maxcellcost = __max(maxcellcost, EnvNAVXYTHETALATCfg.Grid2D[SourceX][SourceY]);
    int currentmaxcost = (int)__max(
            maxcellcost,
            EnvNAVXYTHETALATCfg.Grid2D[SourceX + action->dX][SourceY + action->dY]);

    // use cell cost as multiplicative factor
    return action->cost * (currentmaxcost + 1);
}